

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

bool __thiscall trieste::wf::Fields::build_st(Fields *this,Node *node)

{
  bool bVar1;
  uint uVar2;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  reference psVar3;
  element_type *peVar4;
  Location *pLVar5;
  Token *this_01;
  socklen_t __len;
  undefined8 in_RCX;
  sockaddr *__addr;
  string_view sVar6;
  string local_5a8;
  char *local_588;
  string local_580;
  Log local_560;
  undefined4 local_3c4;
  string local_3c0;
  undefined1 local_3a0 [8];
  shared_ptr<trieste::NodeDef> def;
  iterator __end5;
  iterator __begin5;
  Nodes *__range5;
  char *local_370;
  string local_368;
  undefined1 local_348 [8];
  Error out;
  Nodes defs;
  undefined1 local_178 [8];
  Location name;
  Field *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> *__range2;
  size_t index;
  Token local_128;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_120;
  Node *node_local;
  Fields *this_local;
  Log *local_108;
  Log *local_100;
  _func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
  *local_f8;
  Log *local_f0;
  _func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
  *local_e8;
  Log *local_e0;
  _func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
  *local_d8;
  Log *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  Log *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  Log *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  Log *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  Log *local_90;
  undefined4 local_84;
  Log *local_80;
  undefined4 local_74;
  Log *local_70;
  char (*local_68) [31];
  Log *local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  Log *local_50;
  char (*local_48) [3];
  Log *local_40;
  char (*local_38) [24];
  Log *local_30;
  char **local_28;
  Log *local_20;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  Log *local_10;
  
  local_120 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              node;
  node_local = (Node *)this;
  Token::Token(&local_128,(TokenDef *)Invalid);
  bVar1 = Token::operator==(&this->binding,&local_128);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    Token::Token((Token *)&index,(TokenDef *)Include);
    bVar1 = Token::operator==(&this->binding,(Token *)&index);
    if (bVar1) {
      peVar4 = CLI::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_120);
      NodeDef::include(peVar4);
      this_local._7_1_ = 1;
    }
    else {
      __range2 = (vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> *)0x0;
      __end2 = CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::begin
                         (&this->fields);
      field = (Field *)CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::
                       end(&this->fields);
      while (bVar1 = __gnu_cxx::
                     operator==<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
                               (&__end2,(__normal_iterator<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
                                         *)&field), ((bVar1 ^ 0xffU) & 1) != 0) {
        name.len = (size_t)__gnu_cxx::
                           __normal_iterator<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
                           ::operator*(&__end2);
        bVar1 = Token::operator==((Token *)name.len,&this->binding);
        __len = (socklen_t)in_RCX;
        if (bVar1) {
          peVar4 = CLI::std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_120);
          this_00 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)NodeDef::at(peVar4,(size_t)__range2);
          peVar4 = CLI::std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00);
          pLVar5 = NodeDef::location(peVar4);
          Location::Location((Location *)local_178,pLVar5);
          peVar4 = CLI::std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_120);
          uVar2 = NodeDef::bind(peVar4,(int)(Location *)local_178,__addr,__len);
          if ((uVar2 & 1) == 0) {
            CLI::std::
            __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(local_120);
            NodeDef::scope((NodeDef *)(out.super_Log.strstream.data + 0x180));
            peVar4 = CLI::std::
                     __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(out.super_Log.strstream.data + 0x180));
            NodeDef::look((Nodes *)&stack0xfffffffffffffe60,peVar4,(Location *)local_178);
            CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                      ((shared_ptr<trieste::NodeDef> *)(out.super_Log.strstream.data + 0x180));
            local_108 = (Log *)local_348;
            local_74 = 2;
            local_348._0_4_ = Silent;
            local_70 = local_108;
            if (1 < logging::detail::report_level) {
              logging::Log::start(local_108,Error);
            }
            peVar4 = CLI::std::
                     __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(local_120);
            pLVar5 = NodeDef::location(peVar4);
            Location::origin_linecol_abi_cxx11_(&local_368,pLVar5);
            local_98 = &local_368;
            local_90 = (Log *)local_348;
            bVar1 = logging::Log::is_active((Log *)local_348);
            if (bVar1) {
              logging::append<std::__cxx11::string>((Log *)local_348,local_98);
            }
            local_68 = (char (*) [31])0x381af3;
            local_60 = (Log *)local_348;
            bVar1 = logging::Log::is_active((Log *)local_348);
            if (bVar1) {
              logging::append<char[31]>((Log *)local_348,local_68);
            }
            sVar6 = Location::view((Location *)local_178);
            local_370 = sVar6._M_str;
            __range5 = (Nodes *)sVar6._M_len;
            local_58 = (basic_string_view<char,_std::char_traits<char>_> *)&__range5;
            local_50 = (Log *)local_348;
            bVar1 = logging::Log::is_active((Log *)local_348);
            if (bVar1) {
              logging::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((Log *)local_348,local_58);
            }
            local_48 = (char (*) [3])0x381b12;
            local_40 = (Log *)local_348;
            bVar1 = logging::Log::is_active((Log *)local_348);
            if (bVar1) {
              logging::append<char[3]>((Log *)local_348,local_48);
            }
            local_d8 = std::endl<char,std::char_traits<char>>;
            local_d0 = (Log *)local_348;
            bVar1 = logging::Log::is_active((Log *)local_348);
            if (bVar1) {
              logging::Log::operation((Log *)local_348,local_d8);
            }
            std::__cxx11::string::~string((string *)&local_368);
            __end5 = CLI::std::
                     vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ::begin((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                              *)&stack0xfffffffffffffe60);
            def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CLI::std::
                 vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ::end((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        *)&stack0xfffffffffffffe60);
            while (bVar1 = __gnu_cxx::
                           operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                     (&__end5,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                               *)&def.
                                                  super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), ((bVar1 ^ 0xffU) & 1) != 0) {
              psVar3 = __gnu_cxx::
                       __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                       ::operator*(&__end5);
              CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr
                        ((shared_ptr<trieste::NodeDef> *)local_3a0,psVar3);
              peVar4 = CLI::std::
                       __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_3a0);
              pLVar5 = NodeDef::location(peVar4);
              Location::str_abi_cxx11_(&local_3c0,pLVar5);
              local_a8 = &local_3c0;
              local_a0 = (Log *)local_348;
              bVar1 = logging::Log::is_active((Log *)local_348);
              if (bVar1) {
                logging::append<std::__cxx11::string>((Log *)local_348,local_a8);
              }
              std::__cxx11::string::~string((string *)&local_3c0);
              CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                        ((shared_ptr<trieste::NodeDef> *)local_3a0);
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
              ::operator++(&__end5);
            }
            this_local._7_1_ = 0;
            local_3c4 = 1;
            logging::detail::LogImpl<(trieste::logging::detail::LogLevel)2>::~LogImpl
                      ((LogImpl<(trieste::logging::detail::LogLevel)2> *)local_348);
            CLI::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       *)&stack0xfffffffffffffe60);
          }
          else {
            this_local._7_1_ = 1;
            local_3c4 = 1;
          }
          Location::~Location((Location *)local_178);
          goto LAB_001a2d4e;
        }
        __range2 = (vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> *)
                   ((long)&(__range2->
                           super__Vector_base<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
        __gnu_cxx::
        __normal_iterator<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
        ::operator++(&__end2);
      }
      local_100 = &local_560;
      local_84 = 2;
      local_560.print = Silent;
      local_80 = local_100;
      if (1 < logging::detail::report_level) {
        logging::Log::start(local_100,Error);
      }
      peVar4 = CLI::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_120);
      pLVar5 = NodeDef::location(peVar4);
      Location::origin_linecol_abi_cxx11_(&local_580,pLVar5);
      local_c8 = &local_580;
      local_c0 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::append<std::__cxx11::string>(&local_560,local_c8);
      }
      local_38 = (char (*) [24])0x381b15;
      local_30 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::append<char[24]>(&local_560,local_38);
      }
      peVar4 = CLI::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_120);
      this_01 = NodeDef::type(peVar4);
      local_588 = Token::str(this_01);
      local_28 = &local_588;
      local_20 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::append<char_const*>(&local_560,local_28);
      }
      local_e8 = std::endl<char,std::char_traits<char>>;
      local_e0 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::Log::operation(&local_560,local_e8);
      }
      peVar4 = CLI::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_120);
      pLVar5 = NodeDef::location(peVar4);
      Location::str_abi_cxx11_(&local_5a8,pLVar5);
      local_b8 = &local_5a8;
      local_b0 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::append<std::__cxx11::string>(&local_560,local_b8);
      }
      local_18 = local_120;
      local_10 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::append<std::shared_ptr<trieste::NodeDef>>
                  (&local_560,(shared_ptr<trieste::NodeDef> *)local_18);
      }
      local_f8 = std::endl<char,std::char_traits<char>>;
      local_f0 = &local_560;
      bVar1 = logging::Log::is_active(&local_560);
      if (bVar1) {
        logging::Log::operation(&local_560,local_f8);
      }
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_580);
      logging::detail::LogImpl<(trieste::logging::detail::LogLevel)2>::~LogImpl
                ((LogImpl<(trieste::logging::detail::LogLevel)2> *)&local_560);
      this_local._7_1_ = 0;
    }
  }
LAB_001a2d4e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool build_st(Node& node) const
      {
        if (binding == Invalid)
          return true;

        if (binding == Include)
        {
          node->include();
          return true;
        }

        size_t index = 0;

        for (auto& field : fields)
        {
          if (field.name == binding)
          {
            auto name = node->at(index)->location();

            if (!node->bind(name))
            {
              auto defs = node->scope()->look(name);
              logging::Error out{};

              out << node->location().origin_linecol()
                  << ": conflicting definitions of `" << name.view()
                  << "`:" << std::endl;

              for (auto def : defs)
                out << def->location().str();

              return false;
            }

            return true;
          }

          ++index;
        }

        logging::Error() << node->location().origin_linecol()
                         << ": no binding found for " << node->type().str()
                         << std::endl
                         << node->location().str() << node << std::endl;
        return false;
      }